

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidBatchnorm(void)

{
  RepeatedField<long> *this;
  RepeatedField<float> *pRVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  long lVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  NeuralNetworkLayer *pNVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  void *pvVar15;
  BatchnormLayerParams *pBVar16;
  WeightParams *pWVar17;
  float *pfVar18;
  ostream *poVar19;
  undefined8 *puVar20;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar21;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar22;
  Arena *pAVar23;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00198f8e:
    pRVar21 = &(MStack_78.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar22 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_00198f8e;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar15 = pRVar4->elements[iVar22];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"input",puVar20);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar23);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  this = &pAVar10->shape_;
  uVar2 = (pAVar10->shape_).current_size_;
  uVar3 = (pAVar10->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(this);
  plVar11[uVar2] = 1;
  this->current_size_ = uVar2 + 1;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001990a0:
    pRVar21 = &(MStack_78.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar22 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_001990a0;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar15 = pRVar4->elements[iVar22];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"probs",puVar20);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar23);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar23);
  }
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00199190:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar13);
  }
  else {
    iVar22 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_00199190;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar22 + 1;
    pNVar13 = (NeuralNetworkLayer *)pRVar4->elements[iVar22];
  }
  pRVar4 = (pNVar13->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001991c8:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar22 = (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_001991c8;
    (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar15 = pRVar4->elements[iVar22];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3cb973);
  pRVar4 = (pNVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar22 = (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar22 < pRVar4->allocated_size) {
      (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
      pvVar15 = pRVar4->elements[iVar22];
      goto LAB_00199232;
    }
  }
  pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar13->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar13->output_).super_RepeatedPtrFieldBase,pbVar14);
LAB_00199232:
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3b872d);
  if (pNVar13->_oneof_case_[0] != 0xa0) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 0xa0;
    uVar5 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pBVar16 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::BatchnormLayerParams>(pAVar23);
    (pNVar13->layer_).batchnorm_ = pBVar16;
  }
  pCVar6 = (pNVar13->layer_).convolution_;
  (pCVar6->stride_).arena_or_elements_ = (void *)0x5;
  iVar22 = 5;
  do {
    if ((pCVar6->kernelsize_).arena_or_elements_ == (void *)0x0) {
      uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
      pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar23 = *(Arena **)pAVar23;
      }
      pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar23);
      (pCVar6->kernelsize_).arena_or_elements_ = pWVar17;
    }
    pvVar15 = (pCVar6->kernelsize_).arena_or_elements_;
    pRVar1 = (RepeatedField<float> *)((long)pvVar15 + 0x10);
    uVar2 = *(uint *)((long)pvVar15 + 0x10);
    if (uVar2 == *(uint *)((long)pvVar15 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,*(uint *)((long)pvVar15 + 0x14) + 1);
    }
    pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar18[uVar2] = 1.0;
    pRVar1->current_size_ = uVar2 + 1;
    lVar7._0_4_ = (pCVar6->kernelsize_).current_size_;
    lVar7._4_4_ = (pCVar6->kernelsize_).total_size_;
    if (lVar7 == 0) {
      uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
      pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar23 = *(Arena **)pAVar23;
      }
      pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar23);
      *(WeightParams **)&pCVar6->kernelsize_ = pWVar17;
    }
    lVar7 = *(long *)&pCVar6->kernelsize_;
    pRVar1 = (RepeatedField<float> *)(lVar7 + 0x10);
    uVar2 = *(uint *)(lVar7 + 0x10);
    if (uVar2 == *(uint *)(lVar7 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,*(uint *)(lVar7 + 0x14) + 1);
    }
    pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar18[uVar2] = 1.0;
    pRVar1->current_size_ = uVar2 + 1;
    iVar22 = iVar22 + -1;
  } while (iVar22 != 0);
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar8 = CoreML::Result::good(&local_48);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xb28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar8;
}

Assistant:

int testInvalidBatchnorm() {

    Specification::Model m1;

    int num_inputs = 5;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *batchnormLayer = nn->add_layers();
    batchnormLayer->add_input("input");
    batchnormLayer->add_output("probs");
    auto *params = batchnormLayer->mutable_batchnorm();
    params->set_channels(num_inputs);

    for (int i = 0; i < num_inputs; i++) {
        params->mutable_beta()->add_floatvalue(1.0);
        params->mutable_gamma()->add_floatvalue(1.0);
    }
    // Invalid because the mean and variance should be provided

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}